

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zlagsy.c
# Opt level: O1

int zlagsy_slu(int *n,int *k,double *d,doublecomplex *a,int *lda,int *iseed,doublecomplex *work,
              int *info)

{
  long lVar1;
  double dVar2;
  double dVar3;
  double dVar4;
  double dVar5;
  uint uVar6;
  doublecomplex dVar7;
  uint *puVar8;
  uint *puVar9;
  uint uVar10;
  ulong uVar11;
  double dVar12;
  long lVar13;
  long lVar14;
  int iVar15;
  int iVar16;
  doublecomplex *pdVar17;
  long lVar18;
  int iVar19;
  long lVar20;
  double dVar21;
  long lVar22;
  double *pdVar23;
  long lVar24;
  ulong uVar25;
  long lVar26;
  doublecomplex *pdVar27;
  long lVar28;
  uint uVar29;
  uint uVar30;
  int iVar31;
  bool bVar32;
  uint uVar33;
  uint local_d4;
  int i__1;
  uint local_cc;
  doublecomplex local_c8;
  uint *local_b8;
  double local_b0;
  double local_a8;
  double local_a0;
  long local_98;
  ulong local_90;
  int *local_88;
  uint *local_80;
  doublecomplex local_78;
  int *local_68;
  ulong local_60;
  doublecomplex *local_58;
  long local_50;
  doublecomplex *local_48;
  doublecomplex *local_40;
  ulong local_38;
  
  iVar15 = *lda;
  uVar25 = (ulong)iVar15;
  *info = 0;
  uVar6 = *n;
  if ((int)uVar6 < 0) {
    iVar16 = -1;
  }
  else {
    iVar16 = -2;
    if (((uint)*k < uVar6) && (iVar16 = -5, (int)uVar6 <= *lda)) goto LAB_00109be9;
  }
  *info = iVar16;
LAB_00109be9:
  local_88 = lda;
  local_68 = iseed;
  if (*info < 0) {
    i__1 = -*info;
    input_error("ZLAGSY",&i__1);
  }
  else {
    local_50 = ~uVar25 * 0x10;
    pdVar17 = a + ~uVar25;
    iVar16 = *n;
    uVar11 = (ulong)local_cc;
    zlagsy_slu::j = 1;
    if (0 < iVar16) {
      iVar31 = 1;
      iVar19 = iVar15;
      do {
        local_d4 = *n;
        uVar6 = iVar31 + 1;
        if (iVar31 < (int)local_d4) {
          uVar33 = uVar6;
          if ((int)uVar6 < (int)local_d4) {
            uVar33 = local_d4;
          }
          uVar11 = (ulong)(uint)(iVar31 + iVar19);
          do {
            uVar10 = (int)uVar11 + 1;
            uVar11 = (ulong)uVar10;
            pdVar17[(int)uVar10].r = 0.0;
            pdVar17[(int)uVar10].i = 0.0;
            bVar32 = uVar6 != uVar33;
            uVar6 = uVar6 + 1;
          } while (bVar32);
        }
        zlagsy_slu::j = iVar31 + 1;
        iVar19 = iVar19 + iVar15;
        bVar32 = iVar31 != iVar16;
        iVar31 = zlagsy_slu::j;
      } while (bVar32);
    }
    uVar6 = *n;
    if (0 < (int)uVar6) {
      local_d4 = 0;
      uVar11 = 0;
      do {
        local_d4 = local_d4 + iVar15 + 1;
        pdVar17[(int)local_d4].r = d[uVar11];
        pdVar17[(int)local_d4].i = 0.0;
        uVar11 = uVar11 + 1;
      } while (uVar6 != uVar11);
    }
    local_cc = (uint)uVar11;
    zlagsy_slu::i = *n;
    local_b8 = (uint *)n;
    local_90 = uVar25;
    local_80 = (uint *)k;
    local_58 = pdVar17;
    local_48 = a;
    if (1 < zlagsy_slu::i) {
      local_40 = work + 1;
      local_a8 = (double)(uVar25 * 0x10 + 0x10);
      local_98 = CONCAT44(local_98._4_4_,iVar15 + 1);
      do {
        zlagsy_slu::i = zlagsy_slu::i + -1;
        i__1 = (*n - zlagsy_slu::i) + 1;
        zlarnv_slu(&c__3,local_68,&i__1,work);
        i__1 = (*n - zlagsy_slu::i) + 1;
        zlagsy_slu::wn = dznrm2_(&i__1,work,&c__1);
        local_b0 = zlagsy_slu::wn;
        dVar21 = z_abs(work);
        zlagsy_slu::wa.r = work->r * (local_b0 / dVar21);
        zlagsy_slu::wa.i = (local_b0 / dVar21) * work->i;
        if ((zlagsy_slu::wn != 0.0) ||
           (dVar21 = 0.0, local_c8.r = zlagsy_slu::wa.r, local_c8.i = zlagsy_slu::wa.i,
           NAN(zlagsy_slu::wn))) {
          zlagsy_slu::wb.r = zlagsy_slu::wa.r + work->r;
          zlagsy_slu::wb.i = zlagsy_slu::wa.i + work->i;
          i__1 = *local_b8 - zlagsy_slu::i;
          local_c8.r = zlagsy_slu::wb.r;
          local_c8.i = zlagsy_slu::wb.i;
          z_div(&local_c8,&c_b2,&zlagsy_slu::wb);
          zscal_(&i__1,&local_c8,local_40,&c__1);
          work->r = 1.0;
          work->i = 0.0;
          z_div(&local_c8,&zlagsy_slu::wb,&zlagsy_slu::wa);
          dVar21 = local_c8.r;
        }
        n = (int *)local_b8;
        zlagsy_slu::tau.i = 0.0;
        i__1 = (*local_b8 - zlagsy_slu::i) + 1;
        zlagsy_slu::tau.r = dVar21;
        zlacgv_slu(&i__1,work,&c__1);
        i__1 = (*n - zlagsy_slu::i) + 1;
        zsymv_("Lower",&i__1,&zlagsy_slu::tau,pdVar17 + zlagsy_slu::i * (int)local_98,local_88,work,
               &c__1,&c_b1,work + *n,&c__1);
        i__1 = (*n - zlagsy_slu::i) + 1;
        zlacgv_slu(&i__1,work,&c__1);
        local_a0 = zlagsy_slu::tau.r * -0.5 + zlagsy_slu::tau.i * -0.0;
        local_b0 = zlagsy_slu::tau.i * -0.5 + zlagsy_slu::tau.r * 0.0;
        i__1 = (*n - zlagsy_slu::i) + 1;
        zdotc_(&local_78,&i__1,work,&c__1,work + *n,&c__1);
        zlagsy_slu::alpha.r = local_a0 * local_78.r - local_78.i * local_b0;
        zlagsy_slu::alpha.i = local_a0 * local_78.i + local_b0 * local_78.r;
        local_c8.i = zlagsy_slu::alpha.i;
        local_c8.r = zlagsy_slu::alpha.r;
        i__1 = (*n - zlagsy_slu::i) + 1;
        zaxpy_(&i__1,&zlagsy_slu::alpha,work,&c__1,work + *n,&c__1);
        uVar6 = *n;
        dVar21 = (double)(long)zlagsy_slu::i;
        if (zlagsy_slu::i <= (int)uVar6) {
          uVar10 = uVar6 - zlagsy_slu::i;
          local_a0 = (double)(ulong)uVar10;
          local_60 = CONCAT44(local_60._4_4_,uVar6 + 1);
          lVar18 = (long)dVar21 - 1;
          uVar30 = (int)local_98 * zlagsy_slu::i - 1;
          pdVar23 = (double *)((long)&pdVar17->r + (long)local_a8 * (long)dVar21);
          dVar12 = dVar21;
          pdVar17 = work;
          uVar33 = uVar6;
          do {
            iVar15 = uVar10 + SUB84(dVar12,0);
            lVar13 = 8;
            lVar14 = lVar18;
            local_cc = uVar30;
            uVar29 = uVar33;
            do {
              dVar2 = *(double *)((long)pdVar17 + lVar13 + -8);
              dVar3 = *(double *)((long)&pdVar17->r + lVar13);
              local_78.r = work[(int)uVar29].r * work[(long)dVar12 - (long)dVar21].r -
                           work[(long)dVar12 - (long)dVar21].i * work[(int)uVar29].i;
              local_78.i = work[(int)uVar29].r * work[(long)dVar12 - (long)dVar21].i +
                           work[(long)dVar12 - (long)dVar21].r * work[(int)uVar29].i;
              local_c8.r = (*(double *)((long)pdVar23 + lVar13 + -8) -
                           (dVar2 * work[iVar15].r - work[iVar15].i * dVar3)) - local_78.r;
              local_c8.i = (*(double *)((long)pdVar23 + lVar13) -
                           (dVar2 * work[iVar15].i + work[iVar15].r * dVar3)) - local_78.i;
              *(double *)((long)pdVar23 + lVar13 + -8) = local_c8.r;
              *(double *)((long)pdVar23 + lVar13) = local_c8.i;
              lVar14 = lVar14 + 1;
              local_cc = local_cc + 1;
              lVar13 = lVar13 + 0x10;
              uVar29 = uVar29 + 1;
            } while (lVar14 < (int)uVar6);
            dVar12 = (double)((long)dVar12 + 1);
            lVar18 = lVar18 + 1;
            uVar30 = uVar30 + (int)local_98;
            pdVar23 = (double *)((long)pdVar23 + (long)local_a8);
            pdVar17 = pdVar17 + 1;
            uVar33 = uVar33 + 1;
          } while (uVar6 + 1 != SUB84(dVar12,0));
          uVar25 = local_90;
          pdVar17 = local_58;
          n = (int *)local_b8;
          local_d4 = uVar6;
          local_b0 = dVar21;
          local_38 = (ulong)uVar6;
        }
      } while (1 < zlagsy_slu::i);
    }
    i__1 = ~*local_80 + *n;
    zlagsy_slu::i = 1;
    if (0 < i__1) {
      local_a0 = (double)CONCAT44(local_a0._4_4_,(int)uVar25 + 1);
      local_68 = (int *)((long)&local_48->i + local_50);
      local_98 = uVar25 * 0x10 + 0x10;
      pdVar27 = pdVar17;
      do {
        puVar9 = local_80;
        local_d4 = (*local_b8 - (*local_80 + zlagsy_slu::i)) + 1;
        iVar16 = (int)uVar25;
        zlagsy_slu::wn =
             dznrm2_((integer *)&local_d4,
                     pdVar27 + (int)(zlagsy_slu::i * iVar16 + *local_80 + zlagsy_slu::i),&c__1);
        local_a8 = zlagsy_slu::wn;
        dVar21 = z_abs(pdVar27 + (int)(zlagsy_slu::i * iVar16 + *puVar9 + zlagsy_slu::i));
        iVar15 = zlagsy_slu::i * iVar16 + *puVar9 + zlagsy_slu::i;
        zlagsy_slu::wa.r = pdVar27[iVar15].r * (local_a8 / dVar21);
        zlagsy_slu::wa.i = (local_a8 / dVar21) * pdVar27[iVar15].i;
        local_c8.i = zlagsy_slu::wa.i;
        local_c8.r = zlagsy_slu::wa.r;
        if ((zlagsy_slu::wn != 0.0) || (dVar21 = 0.0, NAN(zlagsy_slu::wn))) {
          zlagsy_slu::wb.r = zlagsy_slu::wa.r + pdVar27[iVar15].r;
          zlagsy_slu::wb.i = zlagsy_slu::wa.i + pdVar27[iVar15].i;
          local_c8.i = zlagsy_slu::wb.i;
          local_c8.r = zlagsy_slu::wb.r;
          local_d4 = *local_b8 - (*puVar9 + zlagsy_slu::i);
          z_div(&local_c8,&c_b2,&zlagsy_slu::wb);
          zscal_((integer *)&local_d4,&local_c8,
                 pdVar27 + (int)(zlagsy_slu::i + *puVar9 + zlagsy_slu::i * iVar16 + 1),&c__1);
          local_d4 = zlagsy_slu::i * iVar16 + *puVar9 + zlagsy_slu::i;
          pdVar27[(int)local_d4].r = 1.0;
          pdVar27[(int)local_d4].i = 0.0;
          z_div(&local_c8,&zlagsy_slu::wb,&zlagsy_slu::wa);
          dVar21 = local_c8.r;
        }
        puVar8 = local_b8;
        zlagsy_slu::tau.i = 0.0;
        iVar15 = zlagsy_slu::i + *puVar9;
        local_d4 = (*local_b8 - iVar15) + 1;
        local_cc = *puVar9 - 1;
        zlagsy_slu::tau.r = dVar21;
        zgemv_("Conjugate transpose",(integer *)&local_d4,(integer *)&local_cc,&c_b2,
               pdVar27 + ((zlagsy_slu::i + 1) * iVar16 + iVar15),local_88,
               pdVar27 + (zlagsy_slu::i * iVar16 + iVar15),&c__1,&c_b1,work,&c__1);
        iVar15 = zlagsy_slu::i + *puVar9;
        local_d4 = (*puVar8 - iVar15) + 1;
        local_cc = *puVar9 - 1;
        local_c8.r = -zlagsy_slu::tau.r;
        local_c8.i._0_4_ = SUB84(zlagsy_slu::tau.i,0);
        local_c8.i._4_4_ = (uint)((ulong)zlagsy_slu::tau.i >> 0x20) ^ 0x80000000;
        zgerc_((integer *)&local_d4,(integer *)&local_cc,&local_c8,
               pdVar27 + (zlagsy_slu::i * iVar16 + iVar15),&c__1,work,&c__1,
               pdVar27 + ((zlagsy_slu::i + 1) * iVar16 + iVar15),local_88);
        uVar25 = local_90;
        puVar8 = local_b8;
        local_d4 = (*local_b8 - (*puVar9 + zlagsy_slu::i)) + 1;
        iVar16 = (int)local_90;
        zlacgv_slu((int *)&local_d4,
                   pdVar27 + (int)(zlagsy_slu::i * (int)local_90 + *puVar9 + zlagsy_slu::i),&c__1);
        iVar15 = *puVar9 + zlagsy_slu::i;
        local_d4 = (*puVar8 - iVar15) + 1;
        zsymv_("Lower",(int *)&local_d4,&zlagsy_slu::tau,pdVar27 + iVar15 * local_a0._0_4_,local_88,
               pdVar27 + (zlagsy_slu::i * iVar16 + iVar15),&c__1,&c_b1,work,&c__1);
        local_d4 = (*local_b8 - (*puVar9 + zlagsy_slu::i)) + 1;
        zlacgv_slu((int *)&local_d4,
                   pdVar27 + (int)(zlagsy_slu::i * iVar16 + *puVar9 + zlagsy_slu::i),&c__1);
        puVar9 = local_b8;
        local_b0 = zlagsy_slu::tau.r * -0.5 + zlagsy_slu::tau.i * -0.0;
        local_a8 = zlagsy_slu::tau.i * -0.5 + zlagsy_slu::tau.r * 0.0;
        local_d4 = (*local_b8 - (*local_80 + zlagsy_slu::i)) + 1;
        zdotc_(&local_78,(integer *)&local_d4,
               pdVar27 + (int)(zlagsy_slu::i * iVar16 + *local_80 + zlagsy_slu::i),&c__1,work,&c__1)
        ;
        puVar8 = local_80;
        zlagsy_slu::alpha.r = local_b0 * local_78.r - local_78.i * local_a8;
        zlagsy_slu::alpha.i = local_b0 * local_78.i + local_a8 * local_78.r;
        local_c8.i = zlagsy_slu::alpha.i;
        local_c8.r = zlagsy_slu::alpha.r;
        local_d4 = (*puVar9 - (*local_80 + zlagsy_slu::i)) + 1;
        zaxpy_((integer *)&local_d4,&zlagsy_slu::alpha,
               pdVar27 + (int)(zlagsy_slu::i * iVar16 + *local_80 + zlagsy_slu::i),&c__1,work,&c__1)
        ;
        iVar15 = zlagsy_slu::i;
        local_d4 = *puVar9;
        lVar18 = (long)(int)local_d4;
        uVar6 = *puVar8;
        local_b0 = (double)(ulong)uVar6;
        local_a8 = (double)(ulong)(uint)zlagsy_slu::i;
        iVar31 = zlagsy_slu::i + uVar6;
        pdVar17 = pdVar27;
        if (iVar31 <= (int)local_d4) {
          lVar13 = (long)iVar31;
          iVar16 = zlagsy_slu::i * iVar16;
          lVar20 = local_98 * lVar13 + (long)local_68;
          lVar22 = lVar13 * 0x10 + (long)local_68 + (long)iVar16 * 0x10;
          lVar24 = 0;
          lVar14 = lVar13;
          do {
            iVar19 = (int)lVar14 - iVar31;
            lVar28 = 0;
            lVar26 = lVar24;
            do {
              dVar21 = *(double *)(lVar22 + -8 + lVar28);
              dVar12 = *(double *)(lVar22 + lVar28);
              dVar2 = work[iVar19].r;
              dVar3 = work[iVar19].i;
              dVar4 = pdVar27[iVar16 + lVar14].r;
              dVar5 = pdVar27[iVar16 + lVar14].i;
              local_78.r = work[(int)lVar26].r * dVar4 - dVar5 * work[(int)lVar26].i;
              local_78.i = work[(int)lVar26].r * dVar5 + dVar4 * work[(int)lVar26].i;
              *(double *)(lVar20 + -8 + lVar28) =
                   (*(double *)(lVar20 + -8 + lVar28) - (dVar21 * dVar2 - dVar3 * dVar12)) -
                   local_78.r;
              *(double *)(lVar20 + lVar28) =
                   (*(double *)(lVar20 + lVar28) - (dVar21 * dVar3 + dVar2 * dVar12)) - local_78.i;
              lVar28 = lVar28 + 0x10;
              lVar1 = lVar13 + lVar26;
              lVar26 = lVar26 + 1;
            } while (lVar1 < lVar18);
            lVar14 = lVar14 + 1;
            lVar20 = lVar20 + local_98;
            lVar22 = lVar22 + 0x10;
            lVar24 = lVar24 + 1;
            uVar25 = local_90;
            pdVar17 = local_58;
            local_cc = local_d4;
            local_60 = (ulong)local_d4;
          } while (local_d4 + 1 != (int)lVar14);
        }
        uVar33 = (uint)((ulong)zlagsy_slu::wa.i >> 0x20) ^ 0x80000000;
        local_c8.i._0_4_ = SUB84(zlagsy_slu::wa.i,0);
        local_c8.r = -zlagsy_slu::wa.r;
        local_c8.i._4_4_ = uVar33;
        dVar7.i._0_4_ = SUB84(zlagsy_slu::wa.i,0);
        dVar7.r = -zlagsy_slu::wa.r;
        dVar7.i._4_4_ = uVar33;
        pdVar17[iVar15 * (int)uVar25 + iVar31] = dVar7;
        if (iVar31 < (int)local_d4) {
          iVar16 = local_a0._0_4_ * iVar15;
          memset(pdVar17 + (int)(uVar6 + iVar16 + 1),0,
                 (ulong)((local_d4 + ~uVar6) - iVar15) * 0x10 + 0x10);
          lVar14 = (long)iVar31;
          local_cc = iVar16 + uVar6;
          iVar15 = SUB84(local_a8,0);
          zlagsy_slu::j = uVar6 + iVar15 + 1;
          do {
            local_cc = local_cc + 1;
            lVar14 = lVar14 + 1;
            zlagsy_slu::j = zlagsy_slu::j + 1;
            uVar25 = local_90;
          } while (lVar14 < lVar18);
        }
        else {
          zlagsy_slu::j = iVar31 + 1;
        }
        zlagsy_slu::i = iVar15 + 1;
        pdVar27 = pdVar17;
      } while (iVar15 < i__1);
    }
    uVar6 = *local_b8;
    zlagsy_slu::j = 1;
    if (0 < (int)uVar6) {
      uVar33 = *local_b8;
      iVar15 = (int)uVar25;
      uVar25 = uVar25 & 0xffffffff;
      uVar10 = 1;
      do {
        zlagsy_slu::i = uVar10 + 1;
        if ((int)uVar10 < (int)uVar33) {
          uVar30 = zlagsy_slu::i;
          if (zlagsy_slu::i < (int)uVar33) {
            uVar30 = uVar33;
          }
          iVar16 = iVar15 * zlagsy_slu::i + uVar10;
          uVar29 = zlagsy_slu::i;
          do {
            iVar31 = (int)uVar25 + uVar29;
            pdVar17[iVar16].r = pdVar17[iVar31].r;
            pdVar17[iVar16].i = pdVar17[iVar31].i;
            iVar16 = iVar16 + iVar15;
            zlagsy_slu::i = uVar29 + 1;
            bVar32 = uVar29 != uVar30;
            uVar29 = zlagsy_slu::i;
          } while (bVar32);
        }
        zlagsy_slu::j = uVar10 + 1;
        uVar25 = (ulong)(uint)((int)uVar25 + iVar15);
        bVar32 = uVar10 != uVar6;
        uVar10 = zlagsy_slu::j;
      } while (bVar32);
    }
  }
  return 0;
}

Assistant:

int zlagsy_slu(int *n, int *k, double *d,
	doublecomplex *a, int *lda, int *iseed, doublecomplex *work,
	int *info)
{
    /* System generated locals */
    int a_dim1, a_offset, i__1, i__2, i__3, i__4, i__5, i__6, i__7, i__8,
	    i__9;
    double d__1;
    doublecomplex z__1, z__2, z__3, z__4;

    /* Local variables */
    static int i, j;
    static doublecomplex alpha;
    extern /* Subroutine */ int zgerc_(int *, int *, doublecomplex *,
	    doublecomplex *, int *, doublecomplex *, int *,
	    doublecomplex *, int *), zscal_(int *, doublecomplex *,
	    doublecomplex *, int *);
    extern /* Double Complex */ void zdotc_(doublecomplex *, int *,
	    doublecomplex *, int *, doublecomplex *, int *);
    extern /* Subroutine */ int	zsymv_(char *, int *,
	    doublecomplex *, doublecomplex *, int *, doublecomplex *,
	    int *, doublecomplex *, doublecomplex *, int *);
    extern double dznrm2_(int *, doublecomplex *, int *);
    static int ii, jj;
    static doublecomplex wa, wb;
    static double wn;
    extern /* Subroutine */ int zlacgv_slu(int *, doublecomplex *, int *), zlarnv_slu(int *,
	    int *, int *, doublecomplex *);
    extern int input_error(char *, int *);
    static doublecomplex tau;


/*  -- LAPACK auxiliary test routine (version 2.0) --   
       Univ. of Tennessee, Univ. of California Berkeley, NAG Ltd.,   
       Courant Institute, Argonne National Lab, and Rice University   
       September 30, 1994   


    Purpose   
    =======   

    ZLAGSY generates a complex symmetric matrix A, by pre- and post-   
    multiplying a real diagonal matrix D with a random unitary matrix:   
    A = U*D*U**T. The semi-bandwidth may then be reduced to k by   
    additional unitary transformations.   

    Arguments   
    =========   

    N       (input) INTEGER   
            The order of the matrix A.  N >= 0.   

    K       (input) INTEGER   
            The number of nonzero subdiagonals within the band of A.   
            0 <= K <= N-1.   

    D       (input) DOUBLE PRECISION array, dimension (N)   
            The diagonal elements of the diagonal matrix D.   

    A       (output) COMPLEX*16 array, dimension (LDA,N)   
            The generated n by n symmetric matrix A (the full matrix is   
            stored).   

    LDA     (input) INTEGER   
            The leading dimension of the array A.  LDA >= N.   

    ISEED   (input/output) INTEGER array, dimension (4)   
            On entry, the seed of the random number generator; the array 
  
            elements must be between 0 and 4095, and ISEED(4) must be   
            odd.   
            On exit, the seed is updated.   

    WORK    (workspace) COMPLEX*16 array, dimension (2*N)   

    INFO    (output) INTEGER   
            = 0: successful exit   
            < 0: if INFO = -i, the i-th argument had an illegal value   

    ===================================================================== 
  


       Test the input arguments   

       Parameter adjustments */
    --d;
    a_dim1 = *lda;
    a_offset = a_dim1 + 1;
    a -= a_offset;
    --iseed;
    --work;

    /* Function Body */
    *info = 0;
    if (*n < 0) {
	*info = -1;
    } else if (*k < 0 || *k > *n - 1) {
	*info = -2;
    } else if (*lda < SUPERLU_MAX(1,*n)) {
	*info = -5;
    }
    if (*info < 0) {
	i__1 = -(*info);
	input_error("ZLAGSY", &i__1);
	return 0;
    }

/*     initialize lower triangle of A to diagonal matrix */

    i__1 = *n;
    for (j = 1; j <= i__1; ++j) {
	i__2 = *n;
	for (i = j + 1; i <= i__2; ++i) {
	    i__3 = i + j * a_dim1;
	    a[i__3].r = 0., a[i__3].i = 0.;
/* L10: */
	}
/* L20: */
    }
    i__1 = *n;
    for (i = 1; i <= i__1; ++i) {
	i__2 = i + i * a_dim1;
	i__3 = i;
	a[i__2].r = d[i__3], a[i__2].i = 0.;
/* L30: */
    }

/*     Generate lower triangle of symmetric matrix */

    for (i = *n - 1; i >= 1; --i) {

/*        generate random reflection */

	i__1 = *n - i + 1;
	zlarnv_slu(&c__3, &iseed[1], &i__1, &work[1]);
	i__1 = *n - i + 1;
	wn = dznrm2_(&i__1, &work[1], &c__1);
	d__1 = wn / z_abs(&work[1]);
	z__1.r = d__1 * work[1].r, z__1.i = d__1 * work[1].i;
	wa.r = z__1.r, wa.i = z__1.i;
	if (wn == 0.) {
	    tau.r = 0., tau.i = 0.;
	} else {
	    z__1.r = work[1].r + wa.r, z__1.i = work[1].i + wa.i;
	    wb.r = z__1.r, wb.i = z__1.i;
	    i__1 = *n - i;
	    z_div(&z__1, &c_b2, &wb);
	    zscal_(&i__1, &z__1, &work[2], &c__1);
	    work[1].r = 1., work[1].i = 0.;
	    z_div(&z__1, &wb, &wa);
	    d__1 = z__1.r;
	    tau.r = d__1, tau.i = 0.;
	}

/*        apply random reflection to A(i:n,i:n) from the left   
          and the right   

          compute  y := tau * A * conjg(u) */

	i__1 = *n - i + 1;
	zlacgv_slu(&i__1, &work[1], &c__1);
	i__1 = *n - i + 1;
	zsymv_("Lower", &i__1, &tau, &a[i + i * a_dim1], lda, &work[1], &c__1,
		 &c_b1, &work[*n + 1], &c__1);
	i__1 = *n - i + 1;
	zlacgv_slu(&i__1, &work[1], &c__1);

/*        compute  v := y - 1/2 * tau * ( u, y ) * u */

	z__3.r = -.5, z__3.i = 0.;
	z__2.r = z__3.r * tau.r - z__3.i * tau.i, z__2.i = z__3.r * tau.i + 
		z__3.i * tau.r;
	i__1 = *n - i + 1;
	zdotc_(&z__4, &i__1, &work[1], &c__1, &work[*n + 1], &c__1);
	z__1.r = z__2.r * z__4.r - z__2.i * z__4.i, z__1.i = z__2.r * z__4.i 
		+ z__2.i * z__4.r;
	alpha.r = z__1.r, alpha.i = z__1.i;
	i__1 = *n - i + 1;
	zaxpy_(&i__1, &alpha, &work[1], &c__1, &work[*n + 1], &c__1);

/*        apply the transformation as a rank-2 update to A(i:n,i:n)   

          CALL ZSYR2( 'Lower', N-I+1, -ONE, WORK, 1, WORK( N+1 ), 1, 
  
          $               A( I, I ), LDA ) */

	i__1 = *n;
	for (jj = i; jj <= i__1; ++jj) {
	    i__2 = *n;
	    for (ii = jj; ii <= i__2; ++ii) {
		i__3 = ii + jj * a_dim1;
		i__4 = ii + jj * a_dim1;
		i__5 = ii - i + 1;
		i__6 = *n + jj - i + 1;
		z__3.r = work[i__5].r * work[i__6].r - work[i__5].i * work[
			i__6].i, z__3.i = work[i__5].r * work[i__6].i + work[
			i__5].i * work[i__6].r;
		z__2.r = a[i__4].r - z__3.r, z__2.i = a[i__4].i - z__3.i;
		i__7 = *n + ii - i + 1;
		i__8 = jj - i + 1;
		z__4.r = work[i__7].r * work[i__8].r - work[i__7].i * work[
			i__8].i, z__4.i = work[i__7].r * work[i__8].i + work[
			i__7].i * work[i__8].r;
		z__1.r = z__2.r - z__4.r, z__1.i = z__2.i - z__4.i;
		a[i__3].r = z__1.r, a[i__3].i = z__1.i;
/* L40: */
	    }
/* L50: */
	}
/* L60: */
    }

/*     Reduce number of subdiagonals to K */

    i__1 = *n - 1 - *k;
    for (i = 1; i <= i__1; ++i) {

/*        generate reflection to annihilate A(k+i+1:n,i) */

	i__2 = *n - *k - i + 1;
	wn = dznrm2_(&i__2, &a[*k + i + i * a_dim1], &c__1);
	d__1 = wn / z_abs(&a[*k + i + i * a_dim1]);
	i__2 = *k + i + i * a_dim1;
	z__1.r = d__1 * a[i__2].r, z__1.i = d__1 * a[i__2].i;
	wa.r = z__1.r, wa.i = z__1.i;
	if (wn == 0.) {
	    tau.r = 0., tau.i = 0.;
	} else {
	    i__2 = *k + i + i * a_dim1;
	    z__1.r = a[i__2].r + wa.r, z__1.i = a[i__2].i + wa.i;
	    wb.r = z__1.r, wb.i = z__1.i;
	    i__2 = *n - *k - i;
	    z_div(&z__1, &c_b2, &wb);
	    zscal_(&i__2, &z__1, &a[*k + i + 1 + i * a_dim1], &c__1);
	    i__2 = *k + i + i * a_dim1;
	    a[i__2].r = 1., a[i__2].i = 0.;
	    z_div(&z__1, &wb, &wa);
	    d__1 = z__1.r;
	    tau.r = d__1, tau.i = 0.;
	}

/*        apply reflection to A(k+i:n,i+1:k+i-1) from the left */

	i__2 = *n - *k - i + 1;
	i__3 = *k - 1;
	zgemv_("Conjugate transpose", &i__2, &i__3, &c_b2, &a[*k + i + (i + 1)
		 * a_dim1], lda, &a[*k + i + i * a_dim1], &c__1, &c_b1, &work[
		1], &c__1);
	i__2 = *n - *k - i + 1;
	i__3 = *k - 1;
	z__1.r = -tau.r, z__1.i = -tau.i;
	zgerc_(&i__2, &i__3, &z__1, &a[*k + i + i * a_dim1], &c__1, &work[1], 
		&c__1, &a[*k + i + (i + 1) * a_dim1], lda);

/*        apply reflection to A(k+i:n,k+i:n) from the left and the rig
ht   

          compute  y := tau * A * conjg(u) */

	i__2 = *n - *k - i + 1;
	zlacgv_slu(&i__2, &a[*k + i + i * a_dim1], &c__1);
	i__2 = *n - *k - i + 1;
	zsymv_("Lower", &i__2, &tau, &a[*k + i + (*k + i) * a_dim1], lda, &a[*
		k + i + i * a_dim1], &c__1, &c_b1, &work[1], &c__1);
	i__2 = *n - *k - i + 1;
	zlacgv_slu(&i__2, &a[*k + i + i * a_dim1], &c__1);

/*        compute  v := y - 1/2 * tau * ( u, y ) * u */

	z__3.r = -.5, z__3.i = 0.;
	z__2.r = z__3.r * tau.r - z__3.i * tau.i, z__2.i = z__3.r * tau.i + 
		z__3.i * tau.r;
	i__2 = *n - *k - i + 1;
	zdotc_(&z__4, &i__2, &a[*k + i + i * a_dim1], &c__1, &work[1], &c__1);
	z__1.r = z__2.r * z__4.r - z__2.i * z__4.i, z__1.i = z__2.r * z__4.i 
		+ z__2.i * z__4.r;
	alpha.r = z__1.r, alpha.i = z__1.i;
	i__2 = *n - *k - i + 1;
	zaxpy_(&i__2, &alpha, &a[*k + i + i * a_dim1], &c__1, &work[1], &c__1)
		;

/*        apply symmetric rank-2 update to A(k+i:n,k+i:n)   

          CALL ZSYR2( 'Lower', N-K-I+1, -ONE, A( K+I, I ), 1, WORK, 1,
   
          $               A( K+I, K+I ), LDA ) */

	i__2 = *n;
	for (jj = *k + i; jj <= i__2; ++jj) {
	    i__3 = *n;
	    for (ii = jj; ii <= i__3; ++ii) {
		i__4 = ii + jj * a_dim1;
		i__5 = ii + jj * a_dim1;
		i__6 = ii + i * a_dim1;
		i__7 = jj - *k - i + 1;
		z__3.r = a[i__6].r * work[i__7].r - a[i__6].i * work[i__7].i, 
			z__3.i = a[i__6].r * work[i__7].i + a[i__6].i * work[
			i__7].r;
		z__2.r = a[i__5].r - z__3.r, z__2.i = a[i__5].i - z__3.i;
		i__8 = ii - *k - i + 1;
		i__9 = jj + i * a_dim1;
		z__4.r = work[i__8].r * a[i__9].r - work[i__8].i * a[i__9].i, 
			z__4.i = work[i__8].r * a[i__9].i + work[i__8].i * a[
			i__9].r;
		z__1.r = z__2.r - z__4.r, z__1.i = z__2.i - z__4.i;
		a[i__4].r = z__1.r, a[i__4].i = z__1.i;
/* L70: */
	    }
/* L80: */
	}

	i__2 = *k + i + i * a_dim1;
	z__1.r = -wa.r, z__1.i = -wa.i;
	a[i__2].r = z__1.r, a[i__2].i = z__1.i;
	i__2 = *n;
	for (j = *k + i + 1; j <= i__2; ++j) {
	    i__3 = j + i * a_dim1;
	    a[i__3].r = 0., a[i__3].i = 0.;
/* L90: */
	}
/* L100: */
    }

/*     Store full symmetric matrix */

    i__1 = *n;
    for (j = 1; j <= i__1; ++j) {
	i__2 = *n;
	for (i = j + 1; i <= i__2; ++i) {
	    i__3 = j + i * a_dim1;
	    i__4 = i + j * a_dim1;
	    a[i__3].r = a[i__4].r, a[i__3].i = a[i__4].i;
/* L110: */
	}
/* L120: */
    }
    return 0;

/*     End of ZLAGSY */

}